

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O0

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::~COpenGLCoreTexture
          (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *this,void **vtt)

{
  u32 uVar1;
  long *in_RSI;
  long *in_RDI;
  u32 i;
  undefined4 in_stack_ffffffffffffffc8;
  u32 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  uint local_14;
  
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18)) = in_RSI[3];
  if (*(int *)((long)in_RDI + 0x84) != 0) {
    (*GL.DeleteTextures)(1,(GLuint *)((long)in_RDI + 0x84));
  }
  if (in_RDI[0x15] != 0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  local_14 = 0;
  while( true ) {
    uVar2 = local_14;
    uVar1 = core::array<irr::video::IImage_*>::size((array<irr::video::IImage_*> *)0x36a6b9);
    if (uVar1 <= uVar2) break;
    core::array<irr::video::IImage_*>::operator[]
              ((array<irr::video::IImage_*> *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_14 = local_14 + 1;
  }
  core::array<irr::video::IImage_*>::~array((array<irr::video::IImage_*> *)0x36a705);
  ITexture::~ITexture((ITexture *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                      (void **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

virtual ~COpenGLCoreTexture()
	{
		if (TextureName)
			GL.DeleteTextures(1, &TextureName);

		if (LockImage)
			LockImage->drop();

		for (u32 i = 0; i < Images.size(); ++i)
			Images[i]->drop();
	}